

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O2

void __thiscall
diy::detail::ReductionFunctor<BlockT,_diy::detail::KDTreePartners>::operator()
          (ReductionFunctor<BlockT,_diy::detail::KDTreePartners> *this,BlockT *b,ProxyWithLink *cp)

{
  KDTreePartners *this_00;
  bool bVar1;
  uint round;
  const_iterator __begin4;
  pointer pBVar2;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  BlockID target;
  ReduceProxy rp;
  _Vector_base<int,_std::allocator<int>_> local_148;
  _Vector_base<int,_std::allocator<int>_> local_128;
  BlockID local_110;
  ReduceProxy local_108;
  
  this_00 = &this->partners;
  bVar1 = KDTreePartners::active
                    (this_00,this->round,(cp->super_Proxy).gid_,(cp->super_Proxy).master_);
  if (bVar1) {
    local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    round = this->round;
    if (0 < (int)round) {
      KDTreePartners::incoming
                (this_00,round,(cp->super_Proxy).gid_,
                 (vector<int,_std::allocator<int>_> *)&local_128,(cp->super_Proxy).master_);
      round = this->round;
    }
    if ((int)round <
        (int)((ulong)((long)(this->partners).rounds_.
                            super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->partners).rounds_.
                           super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      KDTreePartners::outgoing
                (this_00,round,(cp->super_Proxy).gid_,
                 (vector<int,_std::allocator<int>_> *)&local_148,(cp->super_Proxy).master_);
      round = this->round;
    }
    ReduceProxy::ReduceProxy
              (&local_108,&cp->super_Proxy,b,round,this->assigner,(GIDVector *)&local_128,
               (GIDVector *)&local_148);
    std::function<void_(BlockT_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>::
    operator()(&this->reduce,b,&local_108,this_00);
    if (local_108.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ulong)(long)(int)((ulong)((long)local_108.out_link_.neighbors_.
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.out_link_.neighbors_.
                                        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      for (pBVar2 = local_108.out_link_.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pBVar2 != local_108.out_link_.neighbors_.
                    super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                    super__Vector_impl_data._M_finish; pBVar2 = pBVar2 + 1) {
        local_110 = *pBVar2;
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[](&local_108.super_Proxy.outgoing_,&local_110);
      }
    }
    ReduceProxy::~ReduceProxy(&local_108);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_148);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_128);
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }